

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void __thiscall
cubeb_resampler_drift_drop_data_Test::TestBody(cubeb_resampler_drift_drop_data_Test *this)

{
  bool bVar1;
  long count;
  long lVar2;
  size_type sVar3;
  float *pfVar4;
  char *pcVar5;
  reference pvVar6;
  AssertionResult gtest_ar_2;
  long normal_input_frame_count_1;
  long normal_input_frame_count;
  long frames;
  uint32_t i;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  long got;
  long prebuffer_frames;
  long output_seq_idx;
  long seq_idx;
  vector<float,_std::allocator<float>_> output_buffer;
  vector<float,_std::allocator<float>_> input_buffer_normal;
  vector<float,_std::allocator<float>_> input_buffer_glitch;
  vector<float,_std::allocator<float>_> input_buffer_prebuffer;
  long PREBUFFER_FACTOR;
  long UNDERRUN_FACTOR;
  long BUF_BASE_SIZE;
  cubeb_resampler *resampler;
  closure c;
  int target_rate;
  int sample_rate;
  int output_channels;
  cubeb_stream_params output_params;
  cubeb_stream_params input_params;
  uint32_t input_channels;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffe14;
  cubeb_stream_params *in_stack_fffffffffffffe18;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe20;
  cubeb_stream_params *in_stack_fffffffffffffe28;
  float *in_stack_fffffffffffffe30;
  cubeb_stream_params *in_stack_fffffffffffffe38;
  cubeb_stream_params *in_stack_fffffffffffffe40;
  cubeb_stream *in_stack_fffffffffffffe48;
  cubeb_stream_params *in_stack_fffffffffffffe60;
  float *in_stack_fffffffffffffe68;
  AssertHelper local_190;
  Message local_188;
  AssertionResult local_180;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  uint local_154;
  AssertHelper local_150;
  Message local_148;
  AssertionResult local_140;
  uint local_12c;
  AssertHelper local_128;
  Message local_120;
  AssertionResult local_118;
  long local_108;
  ulong local_100;
  long local_f8;
  long local_f0;
  vector<float,_std::allocator<float>_> local_e0 [4];
  vector<float,_std::allocator<float>_> local_80;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  cubeb_stream_params *local_50;
  uint local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_20;
  undefined4 local_1c;
  uint local_18;
  uint local_c;
  
  local_c = 1;
  do {
    if (2 < local_c) {
      return;
    }
    local_38 = 2;
    local_3c = 0xac44;
    local_18 = local_c;
    local_1c = 0xac44;
    local_20 = 2;
    local_2c = 2;
    local_30 = 0xac44;
    local_34 = 2;
    local_40 = 0xac44;
    local_44 = local_c;
    uVar7 = 0;
    uVar8 = 0;
    local_50 = (cubeb_stream_params *)
               cubeb_resampler_create
                         (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                          in_stack_fffffffffffffe38,(uint)((ulong)in_stack_fffffffffffffe30 >> 0x20)
                          ,(cubeb_data_callback)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                          (cubeb_resampler_quality)in_stack_fffffffffffffe60,
                          (cubeb_resampler_reclock)in_stack_fffffffffffffe68);
    local_58 = 0x100;
    local_60 = 10;
    local_68 = 2;
    in_stack_fffffffffffffe48 = (cubeb_stream *)((ulong)local_c << 9);
    std::allocator<float>::allocator((allocator<float> *)0x10bbcb);
    std::vector<float,_std::allocator<float>_>::vector
              (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffe14,uVar8));
    std::allocator<float>::~allocator((allocator<float> *)0x10bbf2);
    count = (ulong)local_c * 0xa00;
    std::allocator<float>::allocator((allocator<float> *)0x10bc13);
    std::vector<float,_std::allocator<float>_>::vector
              (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffe14,uVar8));
    std::allocator<float>::~allocator((allocator<float> *)0x10bc3a);
    lVar2 = (ulong)local_c << 8;
    std::allocator<float>::allocator((allocator<float> *)0x10bc57);
    std::vector<float,_std::allocator<float>_>::vector
              (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffe14,uVar8));
    std::allocator<float>::~allocator((allocator<float> *)0x10bc7e);
    std::allocator<float>::allocator((allocator<float> *)0x10bc8b);
    std::vector<float,_std::allocator<float>_>::vector
              (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffe14,uVar8));
    std::allocator<float>::~allocator((allocator<float> *)0x10bcb2);
    local_f0 = 0;
    local_f8 = 0;
    sVar3 = std::vector<float,_std::allocator<float>_>::size(&local_80);
    local_100 = sVar3 / local_18;
    pfVar4 = std::vector<float,_std::allocator<float>_>::data
                       ((vector<float,_std::allocator<float>_> *)0x10bcf8);
    local_f0 = seq<float>(pfVar4,local_c,local_f0,local_100);
    in_stack_fffffffffffffe60 = local_50;
    in_stack_fffffffffffffe68 =
         std::vector<float,_std::allocator<float>_>::data
                   ((vector<float,_std::allocator<float>_> *)0x10bd39);
    std::vector<float,_std::allocator<float>_>::data
              ((vector<float,_std::allocator<float>_> *)0x10bd4b);
    local_108 = cubeb_resampler_fill
                          ((cubeb_resampler *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                           (long *)CONCAT44(in_stack_fffffffffffffe14,uVar8),
                           (void *)CONCAT44(in_stack_fffffffffffffe0c,uVar7),0x10bd6b);
    local_f8 = local_f8 + 0x100;
    testing::internal::EqHelper<false>::Compare<long,long>
              ((char *)in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
               (long *)in_stack_fffffffffffffe18,(long *)CONCAT44(in_stack_fffffffffffffe14,uVar8));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe20);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x10bde3);
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,0x359,pcVar5);
      testing::internal::AssertHelper::operator=(&local_128,&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      testing::Message::~Message((Message *)0x10be33);
    }
    local_12c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10be58);
    if (local_12c == 0) {
      testing::internal::EqHelper<false>::Compare<long,long>
                ((char *)in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                 (long *)in_stack_fffffffffffffe18,(long *)CONCAT44(in_stack_fffffffffffffe14,uVar8)
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe20);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x10bec3);
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                   ,0x35a,pcVar5);
        testing::internal::AssertHelper::operator=(&local_150,&local_148);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        testing::Message::~Message((Message *)0x10bf13);
      }
      local_12c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bf38);
      if (local_12c == 0) {
        for (local_154 = 0; local_154 < 300; local_154 = local_154 + 1) {
          local_160 = 0x100;
          if ((local_154 == 0) || (local_154 % 100 != 1)) {
            if ((local_154 == 0) || (local_154 % 100 != 2)) {
              pfVar4 = std::vector<float,_std::allocator<float>_>::data
                                 ((vector<float,_std::allocator<float>_> *)0x10c187);
              local_f0 = seq<float>(pfVar4,local_c,local_f0,0x100);
              local_170 = 0x100;
              in_stack_fffffffffffffe18 = local_50;
              in_stack_fffffffffffffe20 =
                   (vector<float,_std::allocator<float>_> *)
                   std::vector<float,_std::allocator<float>_>::data
                             ((vector<float,_std::allocator<float>_> *)0x10c1d1);
              std::vector<float,_std::allocator<float>_>::data
                        ((vector<float,_std::allocator<float>_> *)0x10c1e3);
              local_108 = cubeb_resampler_fill
                                    ((cubeb_resampler *)in_stack_fffffffffffffe20,
                                     in_stack_fffffffffffffe18,
                                     (long *)CONCAT44(in_stack_fffffffffffffe14,uVar8),
                                     (void *)CONCAT44(in_stack_fffffffffffffe0c,uVar7),0x10c203);
              std::vector<float,_std::allocator<float>_>::data
                        ((vector<float,_std::allocator<float>_> *)0x10c218);
              is_seq<float>((float *)in_stack_fffffffffffffe60,(int)((ulong)lVar2 >> 0x20),count,
                            (long)in_stack_fffffffffffffe48);
              local_f8 = local_f8 + 0x100;
            }
            else {
              pfVar4 = std::vector<float,_std::allocator<float>_>::data
                                 ((vector<float,_std::allocator<float>_> *)0x10c09f);
              local_f0 = seq<float>(pfVar4,local_c,local_f0,0x100);
              local_168 = 0x100;
              in_stack_fffffffffffffe28 = local_50;
              in_stack_fffffffffffffe30 =
                   std::vector<float,_std::allocator<float>_>::data
                             ((vector<float,_std::allocator<float>_> *)0x10c0e9);
              std::vector<float,_std::allocator<float>_>::data
                        ((vector<float,_std::allocator<float>_> *)0x10c0fb);
              local_108 = cubeb_resampler_fill
                                    ((cubeb_resampler *)in_stack_fffffffffffffe20,
                                     in_stack_fffffffffffffe18,
                                     (long *)CONCAT44(in_stack_fffffffffffffe14,uVar8),
                                     (void *)CONCAT44(in_stack_fffffffffffffe0c,uVar7),0x10c11b);
              std::vector<float,_std::allocator<float>_>::data
                        ((vector<float,_std::allocator<float>_> *)0x10c130);
              is_not_seq<float>((float *)in_stack_fffffffffffffe60,(int)((ulong)lVar2 >> 0x20),count
                                ,(long)in_stack_fffffffffffffe48);
              pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](local_e0,0x1ff);
              local_f8 = (long)(*pvVar6 + 1.0);
            }
          }
          else {
            pfVar4 = std::vector<float,_std::allocator<float>_>::data
                               ((vector<float,_std::allocator<float>_> *)0x10bfa5);
            local_f0 = seq<float>(pfVar4,local_c,local_f0,0xa00);
            local_160 = 0xa00;
            in_stack_fffffffffffffe38 = local_50;
            in_stack_fffffffffffffe40 =
                 (cubeb_stream_params *)
                 std::vector<float,_std::allocator<float>_>::data
                           ((vector<float,_std::allocator<float>_> *)0x10bfef);
            std::vector<float,_std::allocator<float>_>::data
                      ((vector<float,_std::allocator<float>_> *)0x10c001);
            local_108 = cubeb_resampler_fill
                                  ((cubeb_resampler *)in_stack_fffffffffffffe20,
                                   in_stack_fffffffffffffe18,
                                   (long *)CONCAT44(in_stack_fffffffffffffe14,uVar8),
                                   (void *)CONCAT44(in_stack_fffffffffffffe0c,uVar7),0x10c021);
            std::vector<float,_std::allocator<float>_>::data
                      ((vector<float,_std::allocator<float>_> *)0x10c036);
            is_seq<float>((float *)in_stack_fffffffffffffe60,(int)((ulong)lVar2 >> 0x20),count,
                          (long)in_stack_fffffffffffffe48);
            local_f8 = local_f8 + 0x100;
          }
          testing::internal::EqHelper<false>::Compare<long,long>
                    ((char *)in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                     (long *)in_stack_fffffffffffffe18,
                     (long *)CONCAT44(in_stack_fffffffffffffe14,uVar8));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe20);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x10c298);
            testing::internal::AssertHelper::AssertHelper
                      (&local_190,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                       ,0x37a,pcVar5);
            testing::internal::AssertHelper::operator=(&local_190,&local_188);
            testing::internal::AssertHelper::~AssertHelper(&local_190);
            testing::Message::~Message((Message *)0x10c2d9);
          }
          local_12c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c2fb);
          if (local_12c != 0) goto LAB_0010c338;
        }
        cubeb_resampler_destroy((cubeb_resampler *)CONCAT44(in_stack_fffffffffffffe14,uVar8));
        local_12c = 0;
      }
    }
LAB_0010c338:
    std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffe20);
    std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffe20);
    std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffe20);
    std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffe20);
    if (local_12c != 0) {
      return;
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

TEST(cubeb, resampler_drift_drop_data)
{
  for (uint32_t input_channels = 1; input_channels < 3; input_channels++) {
    cubeb_stream_params input_params;
    cubeb_stream_params output_params;

    const int output_channels = 2;
    const int sample_rate = 44100;

    input_params.channels = input_channels;
    input_params.rate = sample_rate;
    input_params.format = CUBEB_SAMPLE_FLOAT32NE;

    output_params.channels = output_channels;
    output_params.rate = sample_rate;
    output_params.format = CUBEB_SAMPLE_FLOAT32NE;

    int target_rate = input_params.rate;

    closure c;
    c.input_channel_count = input_channels;

    cubeb_resampler * resampler =
      cubeb_resampler_create((cubeb_stream*)nullptr, &input_params, &output_params,
        target_rate, cb_passthrough_resampler_duplex, &c,
        CUBEB_RESAMPLER_QUALITY_VOIP, CUBEB_RESAMPLER_RECLOCK_NONE);

    const long BUF_BASE_SIZE = 256;

    // The factor by which the deadline is missed. This is intentionally
    // kind of large to trigger the frame drop quickly. In real life, multiple
    // smaller under-runs would accumulate.
    const long UNDERRUN_FACTOR = 10;
    // Number buffer used for pre-buffering, that some backends do.
    const long PREBUFFER_FACTOR = 2;

    std::vector<float> input_buffer_prebuffer(input_channels * BUF_BASE_SIZE * PREBUFFER_FACTOR);
    std::vector<float> input_buffer_glitch(input_channels * BUF_BASE_SIZE * UNDERRUN_FACTOR);
    std::vector<float> input_buffer_normal(input_channels * BUF_BASE_SIZE);
    std::vector<float> output_buffer(output_channels * BUF_BASE_SIZE);

    long seq_idx = 0;
    long output_seq_idx = 0;

    long prebuffer_frames = input_buffer_prebuffer.size() / input_params.channels;
    seq_idx = seq(input_buffer_prebuffer.data(), input_channels, seq_idx,
      prebuffer_frames);

    long got = cubeb_resampler_fill(resampler, input_buffer_prebuffer.data(), &prebuffer_frames,
      output_buffer.data(), BUF_BASE_SIZE);

    output_seq_idx += BUF_BASE_SIZE;

    // prebuffer_frames will hold the frames used by the resampler.
    ASSERT_EQ(prebuffer_frames, BUF_BASE_SIZE);
    ASSERT_EQ(got, BUF_BASE_SIZE);

    for (uint32_t i = 0; i < 300; i++) {
      long int frames = BUF_BASE_SIZE;
      if (i != 0 && (i % 100) == 1) {
        // Once in a while, the output thread misses its deadline.
        // The input thread still produces data, so it ends up accumulating. Simulate this by providing a
        // much bigger input buffer. Check that the sequence is now unaligned, meaning we've dropped data
        // to keep everything in sync.
        seq_idx = seq(input_buffer_glitch.data(), input_channels, seq_idx, BUF_BASE_SIZE * UNDERRUN_FACTOR);
        frames = BUF_BASE_SIZE * UNDERRUN_FACTOR;
        got = cubeb_resampler_fill(resampler, input_buffer_glitch.data(), &frames, output_buffer.data(), BUF_BASE_SIZE);
        is_seq(output_buffer.data(), 2, BUF_BASE_SIZE, output_seq_idx);
        output_seq_idx += BUF_BASE_SIZE;
      }
      else if (i != 0 && (i % 100) == 2) {
        // On the next iteration, the sequence should be broken
        seq_idx = seq(input_buffer_normal.data(), input_channels, seq_idx, BUF_BASE_SIZE);
        long normal_input_frame_count = 256;
        got = cubeb_resampler_fill(resampler, input_buffer_normal.data(), &normal_input_frame_count, output_buffer.data(), BUF_BASE_SIZE);
        is_not_seq(output_buffer.data(), output_channels, BUF_BASE_SIZE, output_seq_idx);
        // Reclock so that we can use is_seq again.
        output_seq_idx = output_buffer[BUF_BASE_SIZE * output_channels - 1] + 1;
      }
      else {
        // normal case
        seq_idx = seq(input_buffer_normal.data(), input_channels, seq_idx, BUF_BASE_SIZE);
        long normal_input_frame_count = 256;
        got = cubeb_resampler_fill(resampler, input_buffer_normal.data(), &normal_input_frame_count, output_buffer.data(), BUF_BASE_SIZE);
        is_seq(output_buffer.data(), output_channels, BUF_BASE_SIZE, output_seq_idx);
        output_seq_idx += BUF_BASE_SIZE;
      }
      ASSERT_EQ(got, BUF_BASE_SIZE);
    }

    cubeb_resampler_destroy(resampler);
  }
}